

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_copy_tile_data(opj_tcd_t *p_tcd,OPJ_BYTE *p_src,OPJ_SIZE_T p_src_length)

{
  OPJ_SIZE_T OVar1;
  ulong uVar2;
  OPJ_INT32 *local_90;
  OPJ_INT32 *l_dest_ptr_2;
  OPJ_INT32 *l_src_ptr_2;
  OPJ_INT16 *l_src_ptr_1;
  OPJ_INT32 *l_dest_ptr_1;
  OPJ_INT32 *l_dest_ptr;
  OPJ_CHAR *l_src_ptr;
  OPJ_SIZE_T l_nb_elem;
  OPJ_UINT32 l_remaining;
  OPJ_UINT32 l_size_comp;
  opj_tcd_tilecomp_t *l_tilec;
  opj_image_comp_t *l_img_comp;
  OPJ_SIZE_T l_data_size;
  OPJ_SIZE_T j;
  OPJ_UINT32 i;
  OPJ_SIZE_T p_src_length_local;
  OPJ_BYTE *p_src_local;
  opj_tcd_t *p_tcd_local;
  
  OVar1 = opj_tcd_get_encoded_tile_size(p_tcd);
  if (OVar1 == p_src_length) {
    _l_remaining = p_tcd->tcd_image->tiles->comps;
    l_tilec = (opj_tcd_tilecomp_t *)p_tcd->image->comps;
    p_src_length_local = (OPJ_SIZE_T)p_src;
    for (j._4_4_ = 0; j._4_4_ < p_tcd->image->numcomps; j._4_4_ = j._4_4_ + 1) {
      l_nb_elem._4_4_ = l_tilec->minimum_num_resolutions >> 3;
      uVar2 = (long)(_l_remaining->x1 - _l_remaining->x0) *
              (long)(_l_remaining->y1 - _l_remaining->y0);
      if ((l_tilec->minimum_num_resolutions & 7) != 0) {
        l_nb_elem._4_4_ = l_nb_elem._4_4_ + 1;
      }
      if (l_nb_elem._4_4_ == 3) {
        l_nb_elem._4_4_ = 4;
      }
      if (l_nb_elem._4_4_ == 1) {
        l_dest_ptr = (OPJ_INT32 *)p_src_length_local;
        l_dest_ptr_1 = _l_remaining->data;
        if (*(int *)&l_tilec->resolutions == 0) {
          for (l_data_size = 0; l_data_size < uVar2; l_data_size = l_data_size + 1) {
            *l_dest_ptr_1 = (uint)(byte)*l_dest_ptr;
            l_dest_ptr_1 = l_dest_ptr_1 + 1;
            l_dest_ptr = (OPJ_INT32 *)((long)l_dest_ptr + 1);
          }
        }
        else {
          for (l_data_size = 0; l_data_size < uVar2; l_data_size = l_data_size + 1) {
            *l_dest_ptr_1 = (int)(char)*l_dest_ptr;
            l_dest_ptr_1 = l_dest_ptr_1 + 1;
            l_dest_ptr = (OPJ_INT32 *)((long)l_dest_ptr + 1);
          }
        }
        p_src_length_local = (OPJ_SIZE_T)l_dest_ptr;
      }
      else if (l_nb_elem._4_4_ == 2) {
        l_src_ptr_2 = (OPJ_INT32 *)p_src_length_local;
        l_src_ptr_1 = (OPJ_INT16 *)_l_remaining->data;
        if (*(int *)&l_tilec->resolutions == 0) {
          for (l_data_size = 0; l_data_size < uVar2; l_data_size = l_data_size + 1) {
            *(uint *)l_src_ptr_1 = (uint)(ushort)*l_src_ptr_2;
            l_src_ptr_2 = (OPJ_INT32 *)((long)l_src_ptr_2 + 2);
            l_src_ptr_1 = l_src_ptr_1 + 2;
          }
        }
        else {
          for (l_data_size = 0; l_data_size < uVar2; l_data_size = l_data_size + 1) {
            *(int *)l_src_ptr_1 = (int)(short)*l_src_ptr_2;
            l_src_ptr_2 = (OPJ_INT32 *)((long)l_src_ptr_2 + 2);
            l_src_ptr_1 = l_src_ptr_1 + 2;
          }
        }
        p_src_length_local = (OPJ_SIZE_T)l_src_ptr_2;
      }
      else if (l_nb_elem._4_4_ == 4) {
        l_dest_ptr_2 = (OPJ_INT32 *)p_src_length_local;
        local_90 = _l_remaining->data;
        for (l_data_size = 0; l_data_size < uVar2; l_data_size = l_data_size + 1) {
          *local_90 = *l_dest_ptr_2;
          local_90 = local_90 + 1;
          l_dest_ptr_2 = l_dest_ptr_2 + 1;
        }
        p_src_length_local = (OPJ_SIZE_T)l_dest_ptr_2;
      }
      l_tilec = (opj_tcd_tilecomp_t *)&l_tilec->data_size_needed;
      _l_remaining = _l_remaining + 1;
    }
    p_tcd_local._4_4_ = 1;
  }
  else {
    p_tcd_local._4_4_ = 0;
  }
  return p_tcd_local._4_4_;
}

Assistant:

OPJ_BOOL opj_tcd_copy_tile_data(opj_tcd_t *p_tcd,
                                OPJ_BYTE * p_src,
                                OPJ_SIZE_T p_src_length)
{
    OPJ_UINT32 i;
    OPJ_SIZE_T j;
    OPJ_SIZE_T l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_SIZE_T l_nb_elem;

    l_data_size = opj_tcd_get_encoded_tile_size(p_tcd);
    if (l_data_size != p_src_length) {
        return OPJ_FALSE;
    }

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;
    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */
        l_nb_elem = (OPJ_SIZE_T)(l_tilec->x1 - l_tilec->x0) *
                    (OPJ_SIZE_T)(l_tilec->y1 - l_tilec->y0);

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        switch (l_size_comp) {
        case 1: {
            OPJ_CHAR * l_src_ptr = (OPJ_CHAR *) p_src;
            OPJ_INT32 * l_dest_ptr = l_tilec->data;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
                }
            } else {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (*(l_src_ptr++)) & 0xff;
                }
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        case 2: {
            OPJ_INT32 * l_dest_ptr = l_tilec->data;
            OPJ_INT16 * l_src_ptr = (OPJ_INT16 *) p_src;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
                }
            } else {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (*(l_src_ptr++)) & 0xffff;
                }
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        case 4: {
            OPJ_INT32 * l_src_ptr = (OPJ_INT32 *) p_src;
            OPJ_INT32 * l_dest_ptr = l_tilec->data;

            for (j = 0; j < l_nb_elem; ++j) {
                *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        }

        ++l_img_comp;
        ++l_tilec;
    }

    return OPJ_TRUE;
}